

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool chck_buffer_read_int(void *i,chck_bits bits,chck_buffer *buf)

{
  size_t sVar1;
  _Bool _Var2;
  
  if ((i != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    _Var2 = false;
    if ((bits < (CHCK_BUFFER_B64|CHCK_BUFFER_B8)) &&
       (_Var2 = false, (0x116U >> (bits & 0x1f) & 1) != 0)) {
      sVar1 = chck_buffer_read(i,(ulong)bits,1,buf);
      if (sVar1 == 1) {
        _Var2 = true;
        if (buf->endianess != false) {
          chck_bswap_single(i,(ulong)bits);
        }
      }
      else {
        _Var2 = false;
      }
    }
    return _Var2;
  }
  __assert_fail("i && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x120,"_Bool chck_buffer_read_int(void *, enum chck_bits, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_int(void *i, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(i && buf);

   if (!valid_bits(bits))
      return false;

   if (unlikely(chck_buffer_read(i, bits, 1, buf) != 1))
      return false;

   if (!chck_buffer_native_endianess(buf))
      chck_bswap_single(i, bits);

   return true;
}